

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O0

void __thiscall
bhf::ParameterList::ParameterList(ParameterList *this,initializer_list<bhf::ParameterOption> list)

{
  undefined1 local_80 [8];
  ParameterOption p;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bhf::ParameterOption> *__range2;
  ParameterList *this_local;
  initializer_list<bhf::ParameterOption> list_local;
  
  list_local._M_array = (iterator)list._M_len;
  this_local = (ParameterList *)list._M_array;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
  ::map(&this->map);
  __end2 = std::initializer_list<bhf::ParameterOption>::begin
                     ((initializer_list<bhf::ParameterOption> *)&this_local);
  p._64_8_ = std::initializer_list<bhf::ParameterOption>::end
                       ((initializer_list<bhf::ParameterOption> *)&this_local);
  for (; __end2 != (const_iterator)p._64_8_; __end2 = __end2 + 1) {
    ParameterOption::ParameterOption((ParameterOption *)local_80,__end2);
    std::
    map<std::__cxx11::string,bhf::ParameterOption,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bhf::ParameterOption>>>
    ::emplace<std::__cxx11::string_const&,bhf::ParameterOption&>
              ((map<std::__cxx11::string,bhf::ParameterOption,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bhf::ParameterOption>>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
               ,(ParameterOption *)local_80);
    ParameterOption::~ParameterOption((ParameterOption *)local_80);
  }
  return;
}

Assistant:

ParameterList(std::initializer_list<ParameterOption> list)
    {
        for (auto p: list) {
            map.emplace(p.key, p);
        }
    }